

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbanks_decoder.cpp
# Opt level: O1

HuffmanTree * io::decode_huffman_tree(ROM *rom,uint32_t addr)

{
  byte *pbVar1;
  pointer puVar2;
  uint uVar3;
  HuffmanTree *pHVar4;
  HuffmanTreeNode *pHVar5;
  _Rb_tree_header *p_Var6;
  HuffmanTreeNode *pHVar7;
  HuffmanTreeNode *pHVar8;
  uint uVar9;
  pointer puVar10;
  HuffmanTreeNode *pHVar11;
  
  pHVar4 = (HuffmanTree *)operator_new(0x38);
  pHVar5 = (HuffmanTreeNode *)operator_new(0x20);
  pHVar5->_parent = (HuffmanTreeNode *)0x0;
  *(undefined8 *)&pHVar5->_symbol = 0;
  pHVar5->_leftChild = (HuffmanTreeNode *)0x0;
  pHVar5->_rightChild = (HuffmanTreeNode *)0x0;
  pHVar4->_root_node = pHVar5;
  p_Var6 = &(pHVar4->_encodingTable)._M_t._M_impl.super__Rb_tree_header;
  (pHVar4->_encodingTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pHVar4->_encodingTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pHVar4->_encodingTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header
  ;
  (pHVar4->_encodingTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (pHVar4->_encodingTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar2 = (rom->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar10 = puVar2 + addr;
  uVar3 = 7;
  pHVar11 = pHVar5;
  do {
    addr = addr - 1;
    while( true ) {
      uVar9 = uVar3 & 0xff;
      if ((char)uVar3 < '\0') {
        uVar9 = 7;
      }
      uVar3 = (uVar3 & 0xff) >> 7;
      pbVar1 = puVar10 + uVar3;
      puVar10 = puVar10 + uVar3;
      uVar3 = uVar9 - 1;
      if ((*pbVar1 >> (uVar9 & 0x1f) & 1) != 0) break;
      pHVar7 = (HuffmanTreeNode *)operator_new(0x20);
      pHVar7->_leftChild = (HuffmanTreeNode *)0x0;
      pHVar7->_rightChild = (HuffmanTreeNode *)0x0;
      pHVar7->_parent = (HuffmanTreeNode *)0x0;
      *(undefined8 *)&pHVar7->_symbol = 0;
      pHVar11->_leftChild = pHVar7;
      pHVar7->_parent = pHVar11;
      pHVar11 = pHVar7;
    }
    pHVar11->_symbol = puVar2[addr];
    do {
      pHVar7 = pHVar11;
      pHVar11 = pHVar7->_parent;
      if (pHVar11 == (HuffmanTreeNode *)0x0) break;
    } while (pHVar11->_rightChild != (HuffmanTreeNode *)0x0);
    if (pHVar7 == pHVar5) {
      return pHVar4;
    }
    pHVar8 = (HuffmanTreeNode *)operator_new(0x20);
    pHVar8->_leftChild = (HuffmanTreeNode *)0x0;
    pHVar8->_rightChild = (HuffmanTreeNode *)0x0;
    pHVar8->_parent = (HuffmanTreeNode *)0x0;
    *(undefined8 *)&pHVar8->_symbol = 0;
    pHVar11->_rightChild = pHVar8;
    pHVar8->_parent = pHVar11;
    pHVar11 = pHVar7->_parent->_rightChild;
  } while( true );
}

Assistant:

HuffmanTree* io::decode_huffman_tree(const md::ROM& rom, uint32_t addr)
{
    HuffmanTree* tree = new HuffmanTree();
    HuffmanTreeNode* current_node = tree->root_node();
    uint32_t current_symbol_addr = addr - 1;

    BitstreamReader bitstream(rom.iterator_at(addr));

    while(true)
    {
        if(!bitstream.next_bit())
        {
            // Branch node case
            current_node->left_child(new HuffmanTreeNode());
            current_node = current_node->left_child();
        }
        else
        {
            // Leaf node case: read the symbol value BEFORE the initial offset
            current_node->symbol(rom.get_byte(current_symbol_addr));
            current_symbol_addr -= 1;

            // If current node's parent has a right child, it means we completed this branch of the tree
            // and we need to get back at a higher level
            while (current_node->parent() && current_node->parent()->right_child())
            {
                current_node = current_node->parent();
            }

            // If we got back to root node, it means the whole tree is finished
            if (current_node == tree->root_node())
                return tree;

            current_node->parent()->right_child(new HuffmanTreeNode());
            current_node = current_node->parent()->right_child();
        }
    }
}